

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool mnf::utils::set_is_malloc_allowed(bool allow)

{
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = allow;
  return allow;
}

Assistant:

bool set_is_malloc_allowed(bool allow __attribute__((unused)))
{
#ifdef EIGEN_RUNTIME_NO_MALLOC
  return Eigen::internal::set_is_malloc_allowed(allow);
#else
  eigen_assert(false &&
               "you can't call this function if Manifold was compiled without "
               "the flag EIGEN_RUNTIME_NO_MALLOC");
  return true;
#endif
}